

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::ElemStack::reset(ElemStack *this,uint emptyId,uint unknownId,uint xmlId,uint xmlNSId)

{
  XMLStringPool *this_00;
  short *psVar1;
  short *psVar2;
  ushort uVar3;
  undefined2 *puVar4;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar5;
  uint uVar6;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar7;
  PoolElem *pPVar8;
  ulong uVar9;
  PrefMapElem *p;
  short sVar10;
  long lVar11;
  ushort *puVar12;
  
  if (this->fGlobalNamespaces != (StackElem *)0x0) {
    p = this->fGlobalNamespaces->fMap;
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    if (this->fGlobalNamespaces != (StackElem *)0x0) {
      XMemory::operator_delete((XMemory *)this->fGlobalNamespaces,p);
    }
    this->fGlobalNamespaces = (StackElem *)0x0;
  }
  this->fStackTop = 0;
  if (this->fXMLPoolId == 0) {
    for (pRVar7 = *((this->fPrefixPool).fHashTable)->fBucketList;
        pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
        pRVar7 = pRVar7->fNext) {
      puVar4 = (undefined2 *)pRVar7->fKey;
      if (puVar4 == &XMLUni::fgZeroLenString) goto LAB_002a4c58;
      sVar10 = 0;
      if (puVar4 == (undefined2 *)0x0) {
LAB_002a4c4b:
        if (sVar10 == 0) goto LAB_002a4c58;
      }
      else {
        lVar11 = 0;
        do {
          psVar1 = (short *)((long)&XMLUni::fgZeroLenString + lVar11);
          if (*psVar1 == 0) {
            sVar10 = *(short *)((long)puVar4 + lVar11);
            goto LAB_002a4c4b;
          }
          psVar2 = (short *)((long)puVar4 + lVar11);
          lVar11 = lVar11 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    pRVar7 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_002a4c58:
    if (pRVar7 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
      pPVar8 = (PoolElem *)0x0;
    }
    else {
      pPVar8 = pRVar7->fData;
    }
    this_00 = &this->fPrefixPool;
    if (pPVar8 == (PoolElem *)0x0) {
      uVar6 = XMLStringPool::addNewEntry(this_00,L"");
    }
    else {
      uVar6 = pPVar8->fId;
    }
    this->fGlobalPoolId = uVar6;
    pRVar5 = (this->fPrefixPool).fHashTable;
    uVar9 = 0x78;
    uVar3 = 0x6d;
    puVar12 = &DAT_0036575e;
    do {
      uVar9 = (ulong)uVar3 + (uVar9 >> 0x18) + uVar9 * 0x26;
      uVar3 = *puVar12;
      puVar12 = puVar12 + 1;
    } while (uVar3 != 0);
    for (pRVar7 = pRVar5->fBucketList[uVar9 % pRVar5->fHashModulus];
        pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
        pRVar7 = pRVar7->fNext) {
      puVar4 = (undefined2 *)pRVar7->fKey;
      if (puVar4 == &XMLUni::fgXMLString) goto LAB_002a4d23;
      sVar10 = 0x78;
      if (puVar4 == (undefined2 *)0x0) {
LAB_002a4d16:
        if (sVar10 == 0) goto LAB_002a4d23;
      }
      else {
        lVar11 = 0;
        do {
          psVar1 = (short *)((long)&XMLUni::fgXMLString + lVar11);
          if (*psVar1 == 0) {
            sVar10 = *(short *)((long)puVar4 + lVar11);
            goto LAB_002a4d16;
          }
          psVar2 = (short *)((long)puVar4 + lVar11);
          lVar11 = lVar11 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    pRVar7 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_002a4d23:
    if (pRVar7 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
      pPVar8 = (PoolElem *)0x0;
    }
    else {
      pPVar8 = pRVar7->fData;
    }
    if (pPVar8 == (PoolElem *)0x0) {
      uVar6 = XMLStringPool::addNewEntry(this_00,L"xml");
    }
    else {
      uVar6 = pPVar8->fId;
    }
    this->fXMLPoolId = uVar6;
    pRVar5 = (this->fPrefixPool).fHashTable;
    uVar9 = 0x78;
    uVar3 = 0x6d;
    puVar12 = &DAT_00365832;
    do {
      uVar9 = (ulong)uVar3 + (uVar9 >> 0x18) + uVar9 * 0x26;
      uVar3 = *puVar12;
      puVar12 = puVar12 + 1;
    } while (uVar3 != 0);
    for (pRVar7 = pRVar5->fBucketList[uVar9 % pRVar5->fHashModulus];
        pRVar7 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
        pRVar7 = pRVar7->fNext) {
      puVar4 = (undefined2 *)pRVar7->fKey;
      if (puVar4 == &XMLUni::fgXMLNSString) goto LAB_002a4dea;
      sVar10 = 0x78;
      if (puVar4 == (undefined2 *)0x0) {
LAB_002a4ddd:
        if (sVar10 == 0) goto LAB_002a4dea;
      }
      else {
        lVar11 = 0;
        do {
          psVar1 = (short *)((long)&XMLUni::fgXMLNSString + lVar11);
          if (*psVar1 == 0) {
            sVar10 = *(short *)((long)puVar4 + lVar11);
            goto LAB_002a4ddd;
          }
          psVar2 = (short *)((long)puVar4 + lVar11);
          lVar11 = lVar11 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    pRVar7 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_002a4dea:
    if (pRVar7 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
      pPVar8 = (PoolElem *)0x0;
    }
    else {
      pPVar8 = pRVar7->fData;
    }
    if (pPVar8 == (PoolElem *)0x0) {
      uVar6 = XMLStringPool::addNewEntry(this_00,L"xmlns");
    }
    else {
      uVar6 = pPVar8->fId;
    }
    this->fXMLNSPoolId = uVar6;
  }
  this->fEmptyNamespaceId = emptyId;
  this->fUnknownNamespaceId = unknownId;
  this->fXMLNamespaceId = xmlId;
  this->fXMLNSNamespaceId = xmlNSId;
  return;
}

Assistant:

void ElemStack::reset(  const   unsigned int    emptyId
                        , const unsigned int    unknownId
                        , const unsigned int    xmlId
                        , const unsigned int    xmlNSId)
{
    if(fGlobalNamespaces)
    {
        fMemoryManager->deallocate(fGlobalNamespaces->fMap);
        delete fGlobalNamespaces;
        fGlobalNamespaces = 0;
    }

    // Reset the stack top to clear the stack
    fStackTop = 0;

    // if first time, put in the standard prefixes
    if (fXMLPoolId == 0) {

        fGlobalPoolId = fPrefixPool.addOrFind(XMLUni::fgZeroLenString);
        fXMLPoolId = fPrefixPool.addOrFind(XMLUni::fgXMLString);
        fXMLNSPoolId = fPrefixPool.addOrFind(XMLUni::fgXMLNSString);
    }

    // And store the new special URI ids
    fEmptyNamespaceId = emptyId;
    fUnknownNamespaceId = unknownId;
    fXMLNamespaceId = xmlId;
    fXMLNSNamespaceId = xmlNSId;
}